

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ResourceVersionWrapper.cpp
# Opt level: O0

void * __thiscall
ResourceVersionWrapper::getFieldPtr(ResourceVersionWrapper *this,size_t fId,size_t subField)

{
  version_info *ptr;
  size_t subField_local;
  size_t fId_local;
  ResourceVersionWrapper *this_local;
  
  this_local = (ResourceVersionWrapper *)getVersionInfo(this);
  if ((version_info *)this_local == (version_info *)0x0) {
    this_local = (ResourceVersionWrapper *)0x0;
  }
  else {
    switch(fId) {
    case 0:
      break;
    case 1:
      this_local = (ResourceVersionWrapper *)&((version_info *)this_local)->valueLength;
      break;
    case 2:
      this_local = (ResourceVersionWrapper *)&((version_info *)this_local)->type;
      break;
    case 3:
      this_local = (ResourceVersionWrapper *)((version_info *)this_local)->key;
      break;
    case 4:
      this_local = (ResourceVersionWrapper *)&((version_info *)this_local)->Value;
      break;
    case 5:
      this_local = (ResourceVersionWrapper *)&(((version_info *)this_local)->Value).dwStrucVersion;
      break;
    case 6:
      this_local = (ResourceVersionWrapper *)&(((version_info *)this_local)->Value).dwFileVersionMS;
      break;
    case 7:
      this_local = (ResourceVersionWrapper *)&(((version_info *)this_local)->Value).dwFileVersionLS;
      break;
    case 8:
      this_local = (ResourceVersionWrapper *)
                   &(((version_info *)this_local)->Value).dwProductVersionMS;
      break;
    case 9:
      this_local = (ResourceVersionWrapper *)
                   &(((version_info *)this_local)->Value).dwProductVersionLS;
      break;
    case 10:
      this_local = (ResourceVersionWrapper *)&(((version_info *)this_local)->Value).dwFileFlagsMask;
      break;
    case 0xb:
      this_local = (ResourceVersionWrapper *)&(((version_info *)this_local)->Value).dwFileFlags;
      break;
    case 0xc:
      this_local = (ResourceVersionWrapper *)&(((version_info *)this_local)->Value).dwFileOS;
      break;
    case 0xd:
      this_local = (ResourceVersionWrapper *)&(((version_info *)this_local)->Value).dwFileType;
      break;
    case 0xe:
      this_local = (ResourceVersionWrapper *)&(((version_info *)this_local)->Value).dwFileSubtype;
      break;
    case 0xf:
      this_local = (ResourceVersionWrapper *)&(((version_info *)this_local)->Value).dwFileDateMS;
      break;
    case 0x10:
      this_local = (ResourceVersionWrapper *)&(((version_info *)this_local)->Value).dwFileDateLS;
      break;
    case 0x11:
      this_local = (ResourceVersionWrapper *)&((version_info *)this_local)->children;
    }
  }
  return this_local;
}

Assistant:

void* ResourceVersionWrapper::getFieldPtr(size_t fId, size_t subField)
{
    pe::version_info* ptr = getVersionInfo();

    if (ptr == NULL) return NULL;

    switch (fId) {
        case STRUCT_LEN: return &(ptr->length);
        case VAL_LEN: return &(ptr->valueLength);
        case STRUCT_TYPE: return &(ptr->type);
        case INFO: return &(ptr->key);

        case SIGNATURE: return &(ptr->Value.dwSignature);
        case STRUCT_VER: return &(ptr->Value.dwStrucVersion);
        case FILE_VER_0: return &(ptr->Value.dwFileVersionMS);
        case FILE_VER_1: return &(ptr->Value.dwFileVersionLS);

        case PRODUCT_VER_0: return &(ptr->Value.dwProductVersionMS);
        case PRODUCT_VER_1: return &(ptr->Value.dwProductVersionLS);

        case FLAGS_MASK: return &(ptr->Value.dwFileFlagsMask);
        case FLAGS: return &(ptr->Value.dwFileFlags);
        case OS: return &(ptr->Value.dwFileOS);
        case TYPE: return &(ptr->Value.dwFileType);
        case SUBTYPE: return &(ptr->Value.dwFileSubtype);
        case TIMESTAMP_0: return &(ptr->Value.dwFileDateMS);
        case TIMESTAMP_1: return &(ptr->Value.dwFileDateLS);

        //case PADDING2: return &(ptr->padding2);
        case CHILDREN: return &(ptr->children);
    }
    return ptr;
}